

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  RawBufferView *pRVar1;
  BBox1f BVar2;
  long lVar3;
  PrimRefMB *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  Grid *pGVar19;
  int iVar20;
  undefined4 uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  size_t sVar26;
  size_t *psVar27;
  int iVar28;
  size_t x;
  ulong uVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar58 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  size_t local_268;
  size_t local_210;
  ulong local_1a8;
  ulong local_1a0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_32_4_e9707c6d local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  local_210 = k;
  uVar17 = r->_begin;
  auVar56 = ZEXT464(0x3f800000);
  auVar46 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar33._8_4_ = 0x7f800000;
  auVar33._0_8_ = 0x7f8000007f800000;
  auVar33._12_4_ = 0x7f800000;
  auVar58 = ZEXT1664(auVar33);
  auVar45._8_4_ = 0xff800000;
  auVar45._0_8_ = 0xff800000ff800000;
  auVar45._12_4_ = 0xff800000;
  auVar52 = ZEXT1664(auVar45);
  local_268 = 0;
  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar50 = ZEXT1664(auVar45);
  auVar62 = ZEXT1664(auVar33);
  auVar63 = ZEXT1664(auVar45);
  auVar65 = ZEXT1664(auVar33);
  auVar64 = ZEXT1664((undefined1  [16])0x0);
  do {
    if (r->_end <= uVar17) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar65._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar63._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar62._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar50._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar58._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar52._0_16_;
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar64._0_16_;
      __return_storage_ptr__->max_num_time_segments = local_268;
      auVar45 = vmovlhps_avx(auVar46._0_16_,auVar56._0_16_);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar45._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar45._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar45._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar45._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_GridMesh).super_Geometry.time_range;
    auVar32._8_8_ = 0;
    auVar32._0_4_ = BVar2.lower;
    auVar32._4_4_ = BVar2.upper;
    fVar30 = BVar2.lower;
    auVar45 = vmovshdup_avx(auVar32);
    fVar9 = auVar45._0_4_ - fVar30;
    if (uVar17 < *(ulong *)&(this->super_GridMesh).field_0x70) {
      lVar13 = *(long *)&(this->super_GridMesh).field_0x68 * uVar17;
      lVar3 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
      uVar23 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
      uVar22 = *(uint *)(lVar3 + lVar13);
      if (uVar22 < uVar23) {
        pGVar19 = (Grid *)(lVar3 + lVar13);
        uVar16 = (ulong)pGVar19->resY;
        uVar14 = (ulong)pGVar19->resX;
        if ((pGVar19->lineVtxOffset * (pGVar19->resY - 1) + uVar22 + (uint)pGVar19->resX) - 1 <
            uVar23) {
          fVar42 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
          auVar45 = ZEXT416((uint)(fVar42 * ((t0t1->lower - fVar30) / fVar9) * 1.0000002));
          auVar45 = vroundss_avx(auVar45,auVar45,9);
          auVar45 = vmaxss_avx(auVar41._0_16_,auVar45);
          auVar33 = ZEXT416((uint)(fVar42 * ((t0t1->upper - fVar30) / fVar9) * 0.99999976));
          auVar33 = vroundss_avx(auVar33,auVar33,10);
          auVar33 = vminss_avx(auVar33,ZEXT416((uint)fVar42));
          for (uVar23 = 0; uVar23 != uVar16; uVar23 = uVar23 + 1) {
            for (uVar29 = 0; uVar29 != uVar14; uVar29 = uVar29 + 1) {
              uVar25 = (long)(int)auVar45._0_4_ - 1;
              psVar27 = &(this->super_GridMesh).vertices.items[(int)auVar45._0_4_].
                         super_RawBufferView.stride;
              while (uVar25 = uVar25 + 1, uVar25 <= (ulong)(long)(int)auVar33._0_4_) {
                pRVar1 = (RawBufferView *)(psVar27 + -2);
                sVar26 = *psVar27;
                psVar27 = psVar27 + 7;
                auVar37._8_4_ = 0xddccb9a2;
                auVar37._0_8_ = 0xddccb9a2ddccb9a2;
                auVar37._12_4_ = 0xddccb9a2;
                auVar32 = vcmpps_avx(*(undefined1 (*) [16])
                                      (pRVar1->ptr_ofs +
                                      sVar26 * (uVar23 * pGVar19->lineVtxOffset + (ulong)uVar22 +
                                               uVar29)),auVar37,6);
                auVar39._8_4_ = 0x5dccb9a2;
                auVar39._0_8_ = 0x5dccb9a25dccb9a2;
                auVar39._12_4_ = 0x5dccb9a2;
                auVar37 = vcmpps_avx(*(undefined1 (*) [16])
                                      (pRVar1->ptr_ofs +
                                      sVar26 * (uVar23 * pGVar19->lineVtxOffset + (ulong)uVar22 +
                                               uVar29)),auVar39,1);
                auVar32 = vandps_avx(auVar32,auVar37);
                uVar21 = vmovmskps_avx(auVar32);
                if ((~(byte)uVar21 & 7) != 0) goto LAB_00bf4018;
              }
            }
          }
          uVar23 = 0;
          while (uVar22 = (uint)uVar23, uVar22 < (int)uVar16 - 1U) {
            local_1a0 = 0;
            while( true ) {
              uVar15 = (int)uVar14 - 1;
              uVar16 = (ulong)uVar15;
              uVar18 = (uint)local_1a0;
              if (uVar15 <= uVar18) break;
              local_138 = auVar65._0_16_;
              local_128 = auVar64._0_16_;
              local_118 = auVar63._0_16_;
              local_108 = auVar62._0_16_;
              local_f8 = auVar50._0_16_;
              local_e8 = auVar58._0_16_;
              local_d8 = auVar52._0_16_;
              local_c8 = auVar56._0_16_;
              local_b8 = auVar46._0_16_;
              local_158.sx = &local_1a0;
              local_158.sy = &local_1a8;
              fVar9 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              fVar30 = (this->super_GridMesh).super_Geometry.time_range.lower;
              fVar31 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar30;
              fVar36 = (t0t1->lower - fVar30) / fVar31;
              fVar31 = (t0t1->upper - fVar30) / fVar31;
              fVar30 = fVar9 * fVar36;
              fVar42 = fVar9 * fVar31;
              auVar32 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),9);
              auVar37 = vroundss_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),10);
              auVar45 = vmaxss_avx(auVar32,auVar41._0_16_);
              auVar33 = vminss_avx(auVar37,ZEXT416((uint)fVar9));
              iVar20 = (int)auVar45._0_4_;
              fVar38 = auVar33._0_4_;
              iVar24 = (int)auVar32._0_4_;
              iVar28 = -1;
              if (-1 < iVar24) {
                iVar28 = iVar24;
              }
              iVar10 = (int)fVar9 + 1;
              if ((int)auVar37._0_4_ < (int)fVar9 + 1) {
                iVar10 = (int)auVar37._0_4_;
              }
              local_1a8 = uVar23;
              local_158.this = &this->super_GridMesh;
              local_158.g = pGVar19;
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&blower0,&local_158,(long)iVar20);
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&bupper1,&local_158,(long)(int)fVar38);
              fVar30 = fVar30 - auVar45._0_4_;
              if (iVar10 - iVar28 == 1) {
                auVar45 = vmaxss_avx(ZEXT416((uint)fVar30),ZEXT816(0) << 0x40);
                auVar33 = vshufps_avx(auVar45,auVar45,0);
                auVar45 = ZEXT416((uint)(1.0 - auVar45._0_4_));
                auVar45 = vshufps_avx(auVar45,auVar45,0);
                auVar57._0_4_ =
                     auVar33._0_4_ * bupper1.lower.field_0.m128[0] +
                     auVar45._0_4_ * blower0.lower.field_0.m128[0];
                auVar57._4_4_ =
                     auVar33._4_4_ * bupper1.lower.field_0.m128[1] +
                     auVar45._4_4_ * blower0.lower.field_0.m128[1];
                auVar57._8_4_ =
                     auVar33._8_4_ * bupper1.lower.field_0.m128[2] +
                     auVar45._8_4_ * blower0.lower.field_0.m128[2];
                auVar57._12_4_ =
                     auVar33._12_4_ * bupper1.lower.field_0.m128[3] +
                     auVar45._12_4_ * blower0.lower.field_0.m128[3];
                auVar51._0_4_ =
                     auVar33._0_4_ * bupper1.upper.field_0.m128[0] +
                     auVar45._0_4_ * blower0.upper.field_0.m128[0];
                auVar51._4_4_ =
                     auVar33._4_4_ * bupper1.upper.field_0.m128[1] +
                     auVar45._4_4_ * blower0.upper.field_0.m128[1];
                auVar51._8_4_ =
                     auVar33._8_4_ * bupper1.upper.field_0.m128[2] +
                     auVar45._8_4_ * blower0.upper.field_0.m128[2];
                auVar51._12_4_ =
                     auVar33._12_4_ * bupper1.upper.field_0.m128[3] +
                     auVar45._12_4_ * blower0.upper.field_0.m128[3];
                auVar45 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar42)),ZEXT816(0) << 0x40);
                auVar33 = vshufps_avx(auVar45,auVar45,0);
                auVar45 = ZEXT416((uint)(1.0 - auVar45._0_4_));
                auVar45 = vshufps_avx(auVar45,auVar45,0);
                auVar40._0_4_ =
                     auVar45._0_4_ * bupper1.lower.field_0.m128[0] +
                     auVar33._0_4_ * blower0.lower.field_0.m128[0];
                auVar40._4_4_ =
                     auVar45._4_4_ * bupper1.lower.field_0.m128[1] +
                     auVar33._4_4_ * blower0.lower.field_0.m128[1];
                auVar40._8_4_ =
                     auVar45._8_4_ * bupper1.lower.field_0.m128[2] +
                     auVar33._8_4_ * blower0.lower.field_0.m128[2];
                auVar40._12_4_ =
                     auVar45._12_4_ * bupper1.lower.field_0.m128[3] +
                     auVar33._12_4_ * blower0.lower.field_0.m128[3];
                auVar43._0_4_ =
                     auVar45._0_4_ * bupper1.upper.field_0.m128[0] +
                     auVar33._0_4_ * blower0.upper.field_0.m128[0];
                auVar43._4_4_ =
                     auVar45._4_4_ * bupper1.upper.field_0.m128[1] +
                     auVar33._4_4_ * blower0.upper.field_0.m128[1];
                auVar43._8_4_ =
                     auVar45._8_4_ * bupper1.upper.field_0.m128[2] +
                     auVar33._8_4_ * blower0.upper.field_0.m128[2];
                auVar43._12_4_ =
                     auVar45._12_4_ * bupper1.upper.field_0.m128[3] +
                     auVar33._12_4_ * blower0.upper.field_0.m128[3];
              }
              else {
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&blower1,&local_158,(long)(iVar20 + 1));
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&bupper0,&local_158,(long)((int)fVar38 + -1));
                auVar45 = vmaxss_avx(ZEXT416((uint)fVar30),ZEXT816(0) << 0x40);
                auVar33 = vshufps_avx(auVar45,auVar45,0);
                auVar45 = ZEXT416((uint)(1.0 - auVar45._0_4_));
                auVar45 = vshufps_avx(auVar45,auVar45,0);
                auVar57._0_4_ =
                     auVar33._0_4_ * blower1.lower.field_0.m128[0] +
                     auVar45._0_4_ * blower0.lower.field_0.m128[0];
                auVar57._4_4_ =
                     auVar33._4_4_ * blower1.lower.field_0.m128[1] +
                     auVar45._4_4_ * blower0.lower.field_0.m128[1];
                auVar57._8_4_ =
                     auVar33._8_4_ * blower1.lower.field_0.m128[2] +
                     auVar45._8_4_ * blower0.lower.field_0.m128[2];
                auVar57._12_4_ =
                     auVar33._12_4_ * blower1.lower.field_0.m128[3] +
                     auVar45._12_4_ * blower0.lower.field_0.m128[3];
                auVar51._0_4_ =
                     auVar33._0_4_ * blower1.upper.field_0.m128[0] +
                     auVar45._0_4_ * blower0.upper.field_0.m128[0];
                auVar51._4_4_ =
                     auVar33._4_4_ * blower1.upper.field_0.m128[1] +
                     auVar45._4_4_ * blower0.upper.field_0.m128[1];
                auVar51._8_4_ =
                     auVar33._8_4_ * blower1.upper.field_0.m128[2] +
                     auVar45._8_4_ * blower0.upper.field_0.m128[2];
                auVar51._12_4_ =
                     auVar33._12_4_ * blower1.upper.field_0.m128[3] +
                     auVar45._12_4_ * blower0.upper.field_0.m128[3];
                auVar45 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar42)),ZEXT816(0) << 0x40);
                auVar33 = vshufps_avx(auVar45,auVar45,0);
                auVar45 = ZEXT416((uint)(1.0 - auVar45._0_4_));
                auVar45 = vshufps_avx(auVar45,auVar45,0);
                auVar40._0_4_ =
                     auVar33._0_4_ * bupper0.lower.field_0.m128[0] +
                     auVar45._0_4_ * bupper1.lower.field_0.m128[0];
                auVar40._4_4_ =
                     auVar33._4_4_ * bupper0.lower.field_0.m128[1] +
                     auVar45._4_4_ * bupper1.lower.field_0.m128[1];
                auVar40._8_4_ =
                     auVar33._8_4_ * bupper0.lower.field_0.m128[2] +
                     auVar45._8_4_ * bupper1.lower.field_0.m128[2];
                auVar40._12_4_ =
                     auVar33._12_4_ * bupper0.lower.field_0.m128[3] +
                     auVar45._12_4_ * bupper1.lower.field_0.m128[3];
                auVar43._0_4_ =
                     auVar33._0_4_ * bupper0.upper.field_0.m128[0] +
                     auVar45._0_4_ * bupper1.upper.field_0.m128[0];
                auVar43._4_4_ =
                     auVar33._4_4_ * bupper0.upper.field_0.m128[1] +
                     auVar45._4_4_ * bupper1.upper.field_0.m128[1];
                auVar43._8_4_ =
                     auVar33._8_4_ * bupper0.upper.field_0.m128[2] +
                     auVar45._8_4_ * bupper1.upper.field_0.m128[2];
                auVar43._12_4_ =
                     auVar33._12_4_ * bupper0.upper.field_0.m128[3] +
                     auVar45._12_4_ * bupper1.upper.field_0.m128[3];
                if (iVar24 < 0) {
                  iVar24 = -1;
                }
                sVar26 = (size_t)iVar24;
                while (sVar26 = sVar26 + 1, (long)sVar26 < (long)iVar10) {
                  auVar35._0_4_ = ((float)(int)sVar26 / fVar9 - fVar36) / (fVar31 - fVar36);
                  auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar45 = vshufps_avx(auVar35,auVar35,0);
                  fVar30 = auVar40._4_4_;
                  fVar42 = auVar40._8_4_;
                  fVar38 = auVar40._12_4_;
                  auVar33 = vshufps_avx(ZEXT416((uint)(1.0 - auVar35._0_4_)),
                                        ZEXT416((uint)(1.0 - auVar35._0_4_)),0);
                  fVar59 = auVar57._4_4_;
                  fVar60 = auVar57._8_4_;
                  fVar61 = auVar57._12_4_;
                  fVar47 = auVar43._4_4_;
                  fVar48 = auVar43._8_4_;
                  fVar49 = auVar43._12_4_;
                  fVar53 = auVar51._4_4_;
                  fVar54 = auVar51._8_4_;
                  fVar55 = auVar51._12_4_;
                  local_a8 = auVar43._0_4_ * auVar45._0_4_ + auVar51._0_4_ * auVar33._0_4_;
                  fStack_a4 = fVar47 * auVar45._4_4_ + fVar53 * auVar33._4_4_;
                  fStack_a0 = fVar48 * auVar45._8_4_ + fVar54 * auVar33._8_4_;
                  fStack_9c = fVar49 * auVar45._12_4_ + fVar55 * auVar33._12_4_;
                  GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                            (&bi,&local_158,sVar26);
                  auVar11._4_4_ = fVar30 * auVar45._4_4_ + fVar59 * auVar33._4_4_;
                  auVar11._0_4_ = auVar40._0_4_ * auVar45._0_4_ + auVar57._0_4_ * auVar33._0_4_;
                  auVar11._8_4_ = fVar42 * auVar45._8_4_ + fVar60 * auVar33._8_4_;
                  auVar11._12_4_ = fVar38 * auVar45._12_4_ + fVar61 * auVar33._12_4_;
                  auVar45 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar11);
                  auVar12._4_4_ = fStack_a4;
                  auVar12._0_4_ = local_a8;
                  auVar12._8_4_ = fStack_a0;
                  auVar12._12_4_ = fStack_9c;
                  auVar32 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar12);
                  auVar33 = vminps_avx(auVar45,ZEXT816(0) << 0x40);
                  auVar45 = vmaxps_avx(auVar32,ZEXT816(0) << 0x40);
                  auVar57._0_4_ = auVar57._0_4_ + auVar33._0_4_;
                  auVar57._4_4_ = fVar59 + auVar33._4_4_;
                  auVar57._8_4_ = fVar60 + auVar33._8_4_;
                  auVar57._12_4_ = fVar61 + auVar33._12_4_;
                  auVar40._0_4_ = auVar40._0_4_ + auVar33._0_4_;
                  auVar40._4_4_ = fVar30 + auVar33._4_4_;
                  auVar40._8_4_ = fVar42 + auVar33._8_4_;
                  auVar40._12_4_ = fVar38 + auVar33._12_4_;
                  auVar51._0_4_ = auVar51._0_4_ + auVar45._0_4_;
                  auVar51._4_4_ = fVar53 + auVar45._4_4_;
                  auVar51._8_4_ = fVar54 + auVar45._8_4_;
                  auVar51._12_4_ = fVar55 + auVar45._12_4_;
                  auVar43._0_4_ = auVar43._0_4_ + auVar45._0_4_;
                  auVar43._4_4_ = fVar47 + auVar45._4_4_;
                  auVar43._8_4_ = fVar48 + auVar45._8_4_;
                  auVar43._12_4_ = fVar49 + auVar45._12_4_;
                }
              }
              aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar57,ZEXT416(geomID),0x30);
              uVar15 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
              uVar14 = (ulong)uVar15;
              BVar2 = (this->super_GridMesh).super_Geometry.time_range;
              auVar34._8_8_ = 0;
              auVar34._0_4_ = BVar2.lower;
              auVar34._4_4_ = BVar2.upper;
              aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar51,ZEXT416((uint)local_210),0x30);
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar40,ZEXT416(uVar15),0x30);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar43,ZEXT416(uVar15),0x30);
              auVar33 = vcmpps_avx(local_c8,auVar34,1);
              auVar32 = vinsertps_avx(local_c8,auVar34,0x50);
              auVar45 = vblendps_avx(auVar34,local_c8,2);
              auVar45 = vblendvps_avx(auVar45,auVar32,auVar33);
              auVar56 = ZEXT1664(auVar45);
              auVar44._0_4_ = aVar5.x * 0.5 + aVar7.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
              auVar44._4_4_ = aVar5.y * 0.5 + aVar7.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
              auVar44._8_4_ = aVar5.z * 0.5 + aVar7.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
              auVar44._12_4_ =
                   aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5 +
                   aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
              auVar45 = vminps_avx(local_e8,auVar44);
              auVar58 = ZEXT1664(auVar45);
              auVar45 = vmaxps_avx(local_d8,auVar44);
              auVar52 = ZEXT1664(auVar45);
              auVar45 = vpmovsxbq_avx(ZEXT216(0x101));
              auVar45 = vpinsrq_avx(auVar45,uVar14,1);
              auVar45 = vpaddq_avx(local_128,auVar45);
              auVar64 = ZEXT1664(auVar45);
              auVar45 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar16 >> 8),local_268 < uVar14)),
                                    0x50);
              auVar45 = vpslld_avx(auVar45,0x1f);
              auVar45 = vblendvps_avx(local_b8,auVar34,auVar45);
              auVar46 = ZEXT1664(auVar45);
              auVar45 = vminps_avx(local_138,(undefined1  [16])aVar5);
              auVar65 = ZEXT1664(auVar45);
              if (local_268 <= uVar14) {
                local_268 = uVar14;
              }
              sgrids->items[local_210] =
                   (SubGridBuildData)
                   ((ulong)(uVar18 & 0xfffe | (uint)((uint)pGVar19->resX <= uVar18 + 2) << 0xf) |
                   (ulong)(uVar22 << 0x10 | (uint)((uint)pGVar19->resY <= uVar22 + 2) << 0x1f) |
                   uVar17 << 0x20);
              pPVar4 = prims->items;
              pPVar4[local_210].lbounds.bounds0.lower.field_0.field_1 = aVar5;
              auVar45 = vmaxps_avx(local_118,(undefined1  [16])aVar6);
              auVar63 = ZEXT1664(auVar45);
              pPVar4[local_210].lbounds.bounds0.upper.field_0.field_1 = aVar6;
              auVar45 = vminps_avx(local_108,(undefined1  [16])aVar7);
              auVar62 = ZEXT1664(auVar45);
              pPVar4[local_210].lbounds.bounds1.lower.field_0.field_1 = aVar7;
              auVar45 = vmaxps_avx(local_f8,(undefined1  [16])aVar8);
              auVar50 = ZEXT1664(auVar45);
              pPVar4[local_210].lbounds.bounds1.upper.field_0.field_1 = aVar8;
              pPVar4[local_210].time_range = BVar2;
              local_210 = local_210 + 1;
              uVar14 = (ulong)pGVar19->resX;
              local_1a0 = (ulong)(uVar18 + 2);
              auVar41 = ZEXT864(0) << 0x20;
            }
            uVar16 = (ulong)pGVar19->resY;
            uVar23 = (ulong)(uVar22 + 2);
          }
        }
      }
    }
LAB_00bf4018:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }